

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void set_suffix(void)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  
  pcVar1 = modprefix;
  sVar3 = strlen(modprefix);
  modbase = pcVar1 + sVar3;
  do {
    if (modbase == modprefix) {
LAB_0010541a:
      if (mechname == (char *)0x0) {
        sprintf(suffix,"_%s",modbase);
        mechname = modbase;
      }
      else {
        iVar2 = strcmp(mechname,"nothing");
        if (iVar2 == 0) {
          vectorize = 0;
          suffix[0] = '\0';
          mechname = modbase;
        }
        else {
          sprintf(suffix,"_%s",mechname);
        }
      }
      return;
    }
    if ((*modbase == '\\') || (*modbase == '/')) {
      modbase = modbase + 1;
      goto LAB_0010541a;
    }
    modbase = modbase + -1;
  } while( true );
}

Assistant:

void set_suffix() {
	for (modbase = modprefix + strlen(modprefix); modbase != modprefix;
	    modbase--) {
		if (*modbase == '\\' || *modbase == '/') {
			modbase++;
			break;
		}
	}
	if (!mechname) {
		sprintf(suffix,"_%s", modbase);
		mechname = modbase;
	} else if (strcmp(mechname, "nothing") == 0) {
		vectorize = 0;
		suffix[0] = '\0';
		mechname = modbase;
	}else{
		sprintf(suffix, "_%s", mechname);
	}
}